

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_SetAssetIssuanceTest_Test::TestBody
          (ConfidentialTransaction_SetAssetIssuanceTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  Amount AVar3;
  AssertHelper local_438;
  Message local_430;
  string local_428;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_1;
  Message local_3f0;
  string local_3e8;
  string local_3c8;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar;
  Message local_390 [2];
  IssuanceParameter local_380;
  undefined1 local_310 [8];
  IssuanceParameter param;
  undefined1 local_298 [7];
  bool is_blind;
  ByteData256 contract_hash;
  ConfidentialNonce token_nonce;
  ConfidentialNonce asset_nonce;
  string local_228;
  undefined1 local_208 [8];
  Script token_script;
  string local_1c8;
  undefined1 local_1a8 [8];
  Script asset_script;
  undefined1 local_160 [8];
  Amount token_amount;
  undefined1 local_140 [8];
  Amount asset_amount;
  ConfidentialTransaction tx;
  string local_e8;
  undefined1 local_c8 [8];
  ConfidentialTransaction expect_tx;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  ConfidentialTransaction tx_base;
  ConfidentialTransaction_SetAssetIssuanceTest_Test *this_local;
  
  tx_base.vout_.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
             ,&local_71);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000"
             ,(allocator *)
              ((long)&tx.vout_.
                      super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&asset_amount.ignore_check_,
             (ConfidentialTransaction *)local_50);
  AVar3 = cfd::core::Amount::CreateByCoinAmount(100.0);
  token_amount._8_8_ = AVar3.amount_;
  asset_amount.amount_._0_1_ = AVar3.ignore_check_;
  local_140 = (undefined1  [8])token_amount._8_8_;
  AVar3 = cfd::core::Amount::CreateByCoinAmount(10.0);
  asset_script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)AVar3.amount_;
  token_amount.amount_._0_1_ = AVar3.ignore_check_;
  local_160 = (undefined1  [8])
              asset_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c8,"76a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac",
             (allocator *)
             ((long)&token_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script((Script *)local_1a8,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&token_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_228,"76a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac",
             (allocator *)&asset_nonce.field_0x27);
  cfd::core::Script::Script((Script *)local_208,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&asset_nonce.field_0x27);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&token_nonce.version_);
  cfd::core::ConfidentialNonce::ConfidentialNonce
            ((ConfidentialNonce *)
             &contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_298);
  param.token._39_1_ = 0;
  cfd::core::IssuanceParameter::IssuanceParameter((IssuanceParameter *)local_310);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetAssetIssuance
                (&local_380,(ConfidentialTransaction *)&asset_amount.ignore_check_,0,
                 (Amount *)local_140,(Script *)local_1a8,(ConfidentialNonce *)&token_nonce.version_,
                 (Amount *)local_160,(Script *)local_208,
                 (ConfidentialNonce *)
                 &contract_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(bool)(param.token._39_1_ & 1),
                 (ByteData256 *)local_298);
      cfd::core::IssuanceParameter::operator=((IssuanceParameter *)local_310,&local_380);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_380);
    }
  }
  else {
    testing::Message::Message(local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x4bd,
               "Expected: (param = tx.SetAssetIssuance(0, asset_amount, asset_script, asset_nonce, token_amount, token_script, token_nonce, is_blind, contract_hash)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_390);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_3c8,(AbstractTransaction *)&asset_amount.ignore_check_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_3e8,(AbstractTransaction *)local_c8);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3a8,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x4be,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_428,(BlindFactor *)local_310);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_408,"param.entropy.GetHex().c_str()",
             "\"0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70\"",pcVar2,
             "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
  std::__cxx11::string::~string((string *)&local_428);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x4c1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)local_310);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_298);
  cfd::core::ConfidentialNonce::~ConfidentialNonce
            ((ConfidentialNonce *)
             &contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&token_nonce.version_);
  cfd::core::Script::~Script((Script *)local_208);
  cfd::core::Script::~Script((Script *)local_1a8);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&asset_amount.ignore_check_);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_c8);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_50);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetAssetIssuanceTest) {
  ConfidentialTransaction tx_base(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000");
  ConfidentialTransaction expect_tx(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000");

  // not blind
  ConfidentialTransaction tx(tx_base);
  Amount asset_amount = Amount::CreateByCoinAmount(100.0);
  Amount token_amount = Amount::CreateByCoinAmount(10.0);
  Script asset_script("76a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac");
  Script token_script("76a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac");
  ConfidentialNonce asset_nonce;
  ConfidentialNonce token_nonce;
  ByteData256 contract_hash;
  bool is_blind = false;
  IssuanceParameter param;
  EXPECT_NO_THROW(
      (param = tx.SetAssetIssuance(0, asset_amount, asset_script, asset_nonce,
                                   token_amount, token_script, token_nonce,
                                   is_blind, contract_hash)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
}